

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barray.c
# Opt level: O1

void bit_array_mask(void *dest,void *source,size_t offset)

{
  byte *pbVar1;
  ulong uVar2;
  byte bVar3;
  ulong uVar4;
  
  if ((source != (void *)0x0 && dest != (void *)0x0) && (uVar2 = *dest, offset < uVar2)) {
    uVar4 = 0;
    do {
      if (*source <= uVar4) {
        return;
      }
      if ((*(byte *)((long)source + (uVar4 >> 3) + 8) >> ((uint)uVar4 & 7) & 1) != 0) {
        bVar3 = (char)offset + (char)uVar4 & 7;
        pbVar1 = (byte *)((long)dest + (offset + uVar4 >> 3) + 8);
        *pbVar1 = *pbVar1 & (-2 << bVar3 | 0xfeU >> 8 - bVar3);
      }
      uVar4 = uVar4 + 1;
    } while (uVar2 - offset != uVar4);
  }
  return;
}

Assistant:

void bit_array_mask(void * dest, void * source, size_t offset)
{
	if (dest && source)
	{
		size_t * dsize = (size_t *) dest;
		size_t * ssize = (size_t *) source;
		size_t soffset = 0;
		while (offset < *dsize && soffset < *ssize)
		{
			if (bit_array_test(source, soffset))
			{
				bit_array_clear(dest, offset);
			}
			soffset++;
			offset++;
		}
	}
}